

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceArrayIntersector1>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  long lVar4;
  Primitive *prim;
  byte bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  vint4 bi;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  vint4 ai;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  float fVar24;
  float fVar27;
  float fVar28;
  undefined1 auVar25 [16];
  float fVar29;
  undefined1 auVar26 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  Precalculations pre;
  NodeRef stack [244];
  Precalculations local_881;
  ulong *local_880;
  Ray *local_878;
  RayQueryContext *local_870;
  Primitive *local_868;
  long local_860;
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8[0] != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_880 = local_7d8 + 1;
      auVar15 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar3 = (ray->dir).field_0;
      auVar25._8_4_ = 0x7fffffff;
      auVar25._0_8_ = 0x7fffffff7fffffff;
      auVar25._12_4_ = 0x7fffffff;
      auVar25 = vandps_avx((undefined1  [16])aVar3,auVar25);
      auVar30._8_4_ = 0x219392ef;
      auVar30._0_8_ = 0x219392ef219392ef;
      auVar30._12_4_ = 0x219392ef;
      auVar25 = vcmpps_avx(auVar25,auVar30,1);
      auVar25 = vblendvps_avx((undefined1  [16])aVar3,auVar30,auVar25);
      auVar30 = vrcpps_avx(auVar25);
      fVar24 = auVar30._0_4_;
      auVar21._0_4_ = fVar24 * auVar25._0_4_;
      fVar27 = auVar30._4_4_;
      auVar21._4_4_ = fVar27 * auVar25._4_4_;
      fVar28 = auVar30._8_4_;
      auVar21._8_4_ = fVar28 * auVar25._8_4_;
      fVar29 = auVar30._12_4_;
      auVar21._12_4_ = fVar29 * auVar25._12_4_;
      auVar31._8_4_ = 0x3f800000;
      auVar31._0_8_ = 0x3f8000003f800000;
      auVar31._12_4_ = 0x3f800000;
      auVar25 = vsubps_avx(auVar31,auVar21);
      auVar22._0_4_ = fVar24 + fVar24 * auVar25._0_4_;
      auVar22._4_4_ = fVar27 + fVar27 * auVar25._4_4_;
      auVar22._8_4_ = fVar28 + fVar28 * auVar25._8_4_;
      auVar22._12_4_ = fVar29 + fVar29 * auVar25._12_4_;
      uVar2 = *(undefined4 *)&(ray->org).field_0;
      local_808._4_4_ = uVar2;
      local_808._0_4_ = uVar2;
      local_808._8_4_ = uVar2;
      local_808._12_4_ = uVar2;
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_818._4_4_ = uVar2;
      local_818._0_4_ = uVar2;
      local_818._8_4_ = uVar2;
      local_818._12_4_ = uVar2;
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_828._4_4_ = uVar2;
      local_828._0_4_ = uVar2;
      local_828._8_4_ = uVar2;
      local_828._12_4_ = uVar2;
      local_838 = vshufps_avx(auVar22,auVar22,0);
      auVar25 = vmovshdup_avx(auVar22);
      local_848 = vshufps_avx(auVar22,auVar22,0x55);
      auVar30 = vshufpd_avx(auVar22,auVar22,1);
      uVar13 = (ulong)(auVar22._0_4_ < 0.0) * 0x10;
      auVar26 = ZEXT1664(local_818);
      auVar34 = ZEXT1664(local_848);
      local_858 = vshufps_avx(auVar22,auVar22,0xaa);
      auVar23 = ZEXT1664(local_808);
      auVar33 = ZEXT1664(local_838);
      uVar14 = (ulong)(auVar25._0_4_ < 0.0) << 4 | 0x20;
      auVar32 = ZEXT1664(local_828);
      auVar35 = ZEXT1664(local_858);
      uVar12 = (ulong)(auVar30._0_4_ < 0.0) << 4 | 0x40;
      local_7e8 = vshufps_avx(auVar15,auVar15,0);
      auVar36 = ZEXT1664(local_7e8);
      local_7f8 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
      auVar37 = ZEXT1664(local_7f8);
      local_878 = ray;
      local_870 = context;
LAB_00b86f70:
      if (local_880 != local_7d8) {
        uVar9 = local_880[-1];
        local_880 = local_880 + -1;
        while ((uVar9 & 8) == 0) {
          auVar25 = vsubps_avx(*(undefined1 (*) [16])(uVar9 + 0x20 + uVar13),auVar23._0_16_);
          auVar15._0_4_ = auVar33._0_4_ * auVar25._0_4_;
          auVar15._4_4_ = auVar33._4_4_ * auVar25._4_4_;
          auVar15._8_4_ = auVar33._8_4_ * auVar25._8_4_;
          auVar15._12_4_ = auVar33._12_4_ * auVar25._12_4_;
          auVar25 = vsubps_avx(*(undefined1 (*) [16])(uVar9 + 0x20 + uVar14),auVar26._0_16_);
          auVar16._0_4_ = auVar34._0_4_ * auVar25._0_4_;
          auVar16._4_4_ = auVar34._4_4_ * auVar25._4_4_;
          auVar16._8_4_ = auVar34._8_4_ * auVar25._8_4_;
          auVar16._12_4_ = auVar34._12_4_ * auVar25._12_4_;
          auVar25 = vpmaxsd_avx(auVar15,auVar16);
          auVar15 = vsubps_avx(*(undefined1 (*) [16])(uVar9 + 0x20 + uVar12),auVar32._0_16_);
          auVar17._0_4_ = auVar35._0_4_ * auVar15._0_4_;
          auVar17._4_4_ = auVar35._4_4_ * auVar15._4_4_;
          auVar17._8_4_ = auVar35._8_4_ * auVar15._8_4_;
          auVar17._12_4_ = auVar35._12_4_ * auVar15._12_4_;
          auVar15 = vpmaxsd_avx(auVar17,auVar36._0_16_);
          auVar25 = vpmaxsd_avx(auVar25,auVar15);
          auVar15 = vsubps_avx(*(undefined1 (*) [16])(uVar9 + 0x20 + (uVar13 ^ 0x10)),auVar23._0_16_
                              );
          auVar18._0_4_ = auVar33._0_4_ * auVar15._0_4_;
          auVar18._4_4_ = auVar33._4_4_ * auVar15._4_4_;
          auVar18._8_4_ = auVar33._8_4_ * auVar15._8_4_;
          auVar18._12_4_ = auVar33._12_4_ * auVar15._12_4_;
          auVar15 = vsubps_avx(*(undefined1 (*) [16])(uVar9 + 0x20 + (uVar14 ^ 0x10)),auVar26._0_16_
                              );
          auVar19._0_4_ = auVar34._0_4_ * auVar15._0_4_;
          auVar19._4_4_ = auVar34._4_4_ * auVar15._4_4_;
          auVar19._8_4_ = auVar34._8_4_ * auVar15._8_4_;
          auVar19._12_4_ = auVar34._12_4_ * auVar15._12_4_;
          auVar15 = vpminsd_avx(auVar18,auVar19);
          auVar30 = vsubps_avx(*(undefined1 (*) [16])(uVar9 + 0x20 + (uVar12 ^ 0x10)),auVar32._0_16_
                              );
          auVar20._0_4_ = auVar35._0_4_ * auVar30._0_4_;
          auVar20._4_4_ = auVar35._4_4_ * auVar30._4_4_;
          auVar20._8_4_ = auVar35._8_4_ * auVar30._8_4_;
          auVar20._12_4_ = auVar35._12_4_ * auVar30._12_4_;
          auVar30 = vpminsd_avx(auVar20,auVar37._0_16_);
          auVar15 = vpminsd_avx(auVar15,auVar30);
          auVar25 = vpcmpgtd_avx(auVar25,auVar15);
          iVar7 = vmovmskps_avx(auVar25);
          if (iVar7 == 0xf) goto LAB_00b86f70;
          bVar5 = (byte)iVar7 ^ 0xf;
          uVar8 = uVar9 & 0xfffffffffffffff0;
          lVar4 = 0;
          if (bVar5 != 0) {
            for (; (bVar5 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          uVar9 = *(ulong *)(uVar8 + lVar4 * 8);
          uVar10 = bVar5 - 1 & (uint)bVar5;
          uVar11 = (ulong)uVar10;
          if (uVar10 != 0) {
            do {
              *local_880 = uVar9;
              local_880 = local_880 + 1;
              lVar4 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                }
              }
              uVar9 = *(ulong *)(uVar8 + lVar4 * 8);
              uVar11 = uVar11 - 1 & uVar11;
            } while (uVar11 != 0);
          }
        }
        local_868 = (Primitive *)(uVar9 & 0xfffffffffffffff0);
        local_860 = (ulong)((uint)uVar9 & 0xf) - 7;
        while( true ) {
          local_860 = local_860 + -1;
          if (local_860 == 0) break;
          prim = local_868;
          local_868 = local_868 + 1;
          bVar6 = InstanceArrayIntersector1::occluded(&local_881,ray,local_870,prim);
          auVar37 = ZEXT1664(local_7f8);
          auVar36 = ZEXT1664(local_7e8);
          ray = local_878;
          if (bVar6) {
            local_878->tfar = -INFINITY;
            return;
          }
        }
        auVar23 = ZEXT1664(local_808);
        auVar26 = ZEXT1664(local_818);
        auVar32 = ZEXT1664(local_828);
        auVar33 = ZEXT1664(local_838);
        auVar34 = ZEXT1664(local_848);
        auVar35 = ZEXT1664(local_858);
        goto LAB_00b86f70;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }